

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall
VmaDefragmentationContext_T::~VmaDefragmentationContext_T(VmaDefragmentationContext_T *this)

{
  uint uVar1;
  VmaBlockVector **ppVVar2;
  void *__ptr;
  VkAllocationCallbacks *pVVar3;
  ulong uVar4;
  
  if (this->m_PoolBlockVector == (VmaBlockVector *)0x0) {
    uVar1 = this->m_BlockVectorCount;
    if ((ulong)uVar1 != 0) {
      ppVVar2 = this->m_pBlockVectors;
      uVar4 = 0;
      do {
        if (ppVVar2[uVar4] != (VmaBlockVector *)0x0) {
          ppVVar2[uVar4]->m_IncrementalSort = true;
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  else {
    this->m_PoolBlockVector->m_IncrementalSort = true;
  }
  __ptr = this->m_AlgorithmState;
  if ((__ptr != (void *)0x0) && ((this->m_Algorithm == 8 || (this->m_Algorithm == 2)))) {
    pVVar3 = (this->m_MoveAllocator).m_pCallbacks;
    if ((pVVar3 == (VkAllocationCallbacks *)0x0) || (pVVar3->pfnFree == (PFN_vkFreeFunction)0x0)) {
      free(__ptr);
    }
    else {
      (*pVVar3->pfnFree)(pVVar3->pUserData,__ptr);
    }
  }
  VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::~VmaVector
            (&this->m_Moves);
  return;
}

Assistant:

VmaDefragmentationContext_T::~VmaDefragmentationContext_T()
{
    if (m_PoolBlockVector != VMA_NULL)
    {
        m_PoolBlockVector->SetIncrementalSort(true);
    }
    else
    {
        for (uint32_t i = 0; i < m_BlockVectorCount; ++i)
        {
            VmaBlockVector* vector = m_pBlockVectors[i];
            if (vector != VMA_NULL)
                vector->SetIncrementalSort(true);
        }
    }

    if (m_AlgorithmState)
    {
        switch (m_Algorithm)
        {
        case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_BALANCED_BIT:
            vma_delete_array(m_MoveAllocator.m_pCallbacks, reinterpret_cast<StateBalanced*>(m_AlgorithmState), m_BlockVectorCount);
            break;
        case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_EXTENSIVE_BIT:
            vma_delete_array(m_MoveAllocator.m_pCallbacks, reinterpret_cast<StateExtensive*>(m_AlgorithmState), m_BlockVectorCount);
            break;
        default:
            VMA_ASSERT(0);
        }
    }
}